

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O2

size_t enet_range_coder_compress
                 (void *context,ENetBuffer *inBuffers,size_t inBufferCount,size_t inLimit,
                 enet_uint8 *outData,size_t outLimit)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  enet_uint16 eVar4;
  int iVar5;
  ushort uVar6;
  short sVar7;
  uint uVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  ushort uVar11;
  undefined8 *puVar12;
  ushort *puVar13;
  uint uVar14;
  ulong uVar15;
  enet_uint8 *peVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ushort *puVar20;
  uint uVar21;
  ulong uStack_a0;
  enet_uint16 predicted;
  undefined8 *local_90;
  size_t local_88;
  uint local_7c;
  ulong local_78;
  byte *local_70;
  ENetBuffer *local_68;
  byte *local_60;
  enet_uint8 *local_58;
  ulong local_50;
  long local_48;
  enet_uint8 *local_40;
  ulong local_38;
  ulong uVar22;
  
  local_58 = outData;
  predicted = 0;
  local_88 = 0;
  if (inLimit == 0 || (inBufferCount == 0 || context == (void *)0x0)) {
    return 0;
  }
  peVar16 = outData + outLimit;
  local_60 = (byte *)inBuffers->data;
  local_70 = local_60 + inBuffers->dataLength;
  local_68 = inBuffers + 1;
  lVar18 = inBufferCount - 1;
  *(undefined8 *)context = 0;
  *(undefined8 *)((long)context + 8) = 0;
  *(undefined4 *)((long)context + 10) = 0x1010001;
  uStack_a0 = 1;
  uVar22 = 0xffffffffffffffff;
  uVar19 = 0;
  local_38 = 0;
  local_90 = (undefined8 *)context;
LAB_0010263d:
  if (local_60 < local_70) {
  }
  else {
    if (lVar18 == 0) {
      local_88 = (long)outData - (long)local_58;
      while( true ) {
        if ((int)uVar19 == 0) {
          return local_88;
        }
        if (peVar16 <= outData) break;
        *outData = (enet_uint8)(uVar19 >> 0x18);
        outData = outData + 1;
        uVar19 = (ulong)(uint)((int)uVar19 << 8);
        local_88 = local_88 + 1;
      }
      return 0;
    }
    local_60 = (byte *)local_68->data;
    local_70 = local_60 + local_68->dataLength;
    local_68 = local_68 + 1;
    lVar18 = lVar18 + -1;
  }
  bVar1 = *local_60;
  local_60 = local_60 + 1;
  local_7c = (uint)bVar1;
  puVar13 = &predicted;
  puVar20 = puVar13;
LAB_00102695:
  uVar6 = *puVar20;
  if (uVar6 != 0) {
    puVar9 = (undefined8 *)((long)context + (ulong)uVar6 * 2 * 8);
    uVar11 = *(ushort *)(puVar9 + 1);
    if (uVar11 == 0) {
      lVar17 = uStack_a0 * 0x10;
      *(byte *)((long)context + uStack_a0 * 2 * 8) = bVar1;
      *(undefined1 *)((long)context + lVar17 + 1) = 2;
      *(undefined2 *)((long)context + lVar17 + 2) = 2;
      *(undefined8 *)((long)context + lVar17 + 4) = 0;
      *(undefined4 *)((long)context + lVar17 + 0xc) = 0;
      puVar10 = (undefined8 *)((long)context + uStack_a0 * 2 * 8);
      *(short *)((long)context + ((ulong)uVar6 * 2 + 1) * 8) =
           (short)((int)lVar17 + (uint)uVar6 * -0x10 >> 4);
      uVar15 = 0;
      uVar8 = 0;
      uStack_a0 = uStack_a0 + 1;
    }
    else {
      uVar6 = 0;
      puVar12 = puVar9;
      do {
        while( true ) {
          puVar10 = puVar12 + (ulong)uVar11 * 2;
          if (*(byte *)(puVar12 + (ulong)uVar11 * 2) <= bVar1) break;
          *(short *)((long)puVar10 + 2) = *(short *)((long)puVar10 + 2) + 2;
          uVar11 = *(ushort *)((long)puVar10 + 4);
          puVar12 = puVar10;
          if (uVar11 == 0) {
            lVar17 = uStack_a0 * 0x10;
            *(byte *)((long)context + uStack_a0 * 2 * 8) = bVar1;
            *(undefined1 *)((long)context + lVar17 + 1) = 2;
            *(undefined2 *)((long)context + lVar17 + 2) = 2;
            *(undefined8 *)((long)local_90 + lVar17 + 4) = 0;
            *(undefined4 *)((long)local_90 + lVar17 + 0xc) = 0;
            *(short *)((long)puVar10 + 4) =
                 (short)((uint)((int)(undefined8 *)((long)context + uStack_a0 * 2 * 8) -
                               (int)puVar10) >> 4);
            puVar10 = (undefined8 *)((long)context + uStack_a0 * 2 * 8);
            goto LAB_00102788;
          }
        }
        if (bVar1 <= *(byte *)(puVar12 + (ulong)uVar11 * 2)) {
          bVar2 = *(byte *)((long)puVar10 + 1);
          uVar15 = (ulong)bVar2;
          uVar6 = (uVar6 - bVar2) + *(short *)((long)puVar10 + 2);
          *(short *)((long)puVar10 + 2) = *(short *)((long)puVar10 + 2) + 2;
          *(byte *)((long)puVar10 + 1) = bVar2 + 2;
          goto LAB_0010278b;
        }
        uVar6 = uVar6 + *(short *)((long)puVar10 + 2);
        uVar11 = *(ushort *)((long)puVar10 + 6);
        puVar12 = puVar10;
      } while (uVar11 != 0);
      lVar17 = uStack_a0 * 0x10;
      *(byte *)((long)context + uStack_a0 * 2 * 8) = bVar1;
      *(undefined1 *)((long)context + lVar17 + 1) = 2;
      *(undefined2 *)((long)context + lVar17 + 2) = 2;
      *(undefined8 *)((long)local_90 + lVar17 + 4) = 0;
      *(undefined4 *)((long)local_90 + lVar17 + 0xc) = 0;
      *(short *)((long)puVar10 + 6) =
           (short)((uint)((int)(undefined8 *)((long)context + uStack_a0 * 2 * 8) - (int)puVar10) >>
                  4);
      puVar10 = (undefined8 *)((long)context + uStack_a0 * 2 * 8);
LAB_00102788:
      uVar15 = 0;
      uStack_a0 = uStack_a0 + 1;
      context = local_90;
LAB_0010278b:
      uVar8 = (uint)uVar6;
    }
    *puVar13 = (ushort)((uint)((int)puVar10 - (int)context) >> 4);
    uVar6 = *(ushort *)((long)puVar9 + 0xc);
    uVar14 = (uint)uVar15;
    if (uVar14 != 0) {
      iVar5 = (int)((uVar22 & 0xffffffff) / (ulong)uVar6);
      uVar8 = (uVar8 + *(ushort *)((long)puVar9 + 10)) * iVar5 + (int)uVar19;
      uVar21 = iVar5 * uVar14;
      do {
        uVar22 = (ulong)uVar21;
        uVar19 = (ulong)uVar8;
        if (0xffffff < (uVar21 + uVar8 ^ uVar8)) {
          if (0xffff < uVar21) goto LAB_001028b5;
          uVar21 = -uVar8 & 0xffff;
        }
        if (peVar16 <= outData) {
          return local_88;
        }
        *outData = (enet_uint8)(uVar8 >> 0x18);
        outData = outData + 1;
        uVar21 = uVar21 << 8;
        uVar8 = uVar8 << 8;
      } while( true );
    }
    uVar11 = *(ushort *)((long)puVar9 + 10);
    if (uVar11 < uVar6 && uVar11 != 0) {
      uVar8 = (int)((uVar22 & 0xffffffff) / (ulong)uVar6) * (uint)uVar11;
      do {
        uVar22 = (ulong)uVar8;
        uVar21 = (uint)uVar19;
        if (0xffffff < (uVar8 + uVar21 ^ uVar21)) {
          if (0xffff < uVar8) goto LAB_001028c3;
          uVar8 = -uVar21 & 0xffff;
        }
        if (peVar16 <= outData) {
          return local_88;
        }
        *outData = (enet_uint8)(uVar19 >> 0x18);
        outData = outData + 1;
        uVar8 = uVar8 << 8;
        uVar19 = (ulong)(uVar21 << 8);
      } while( true );
    }
    goto LAB_001028cd;
  }
  uVar14 = (uint)*(ushort *)((long)context + 8);
  puVar9 = (undefined8 *)context;
  uVar8 = local_7c;
  if (*(ushort *)((long)context + 8) != 0) goto LAB_001029a6;
  lVar17 = uStack_a0 * 0x10;
  *(byte *)((long)context + uStack_a0 * 2 * 8) = bVar1;
  *(undefined1 *)((long)context + lVar17 + 1) = 3;
  *(undefined2 *)((long)context + lVar17 + 2) = 3;
  *(undefined8 *)((long)context + lVar17 + 4) = 0;
  *(undefined4 *)((long)context + lVar17 + 0xc) = 0;
  *(short *)((long)context + 8) = (short)uStack_a0;
  puVar10 = (undefined8 *)((long)context + uStack_a0 * 2 * 8);
  uVar14 = 1;
  uStack_a0 = uStack_a0 + 1;
  goto LAB_00102aa5;
LAB_001028b5:
  sVar3 = *(short *)((long)puVar9 + 0xc);
  goto LAB_001028d8;
LAB_001028c3:
  uVar11 = *(ushort *)((long)puVar9 + 10);
  uVar6 = *(ushort *)((long)puVar9 + 0xc);
LAB_001028cd:
  *(ushort *)((long)puVar9 + 10) = uVar11 + 5;
  sVar3 = uVar6 + 5;
  context = local_90;
LAB_001028d8:
  *(ushort *)((long)puVar9 + 0xc) = sVar3 + 2U;
  if ((0xfb < uVar14) || (0xff00 < (ushort)(sVar3 + 2U))) {
    if (*(ushort *)(puVar9 + 1) == 0) {
      eVar4 = 0;
    }
    else {
      local_78 = uStack_a0;
      local_50 = uVar15;
      local_48 = lVar18;
      local_40 = peVar16;
      eVar4 = enet_symbol_rescale((ENetSymbol *)(puVar9 + (ulong)*(ushort *)(puVar9 + 1) * 2));
      local_88 = 0;
      uVar15 = local_50;
      peVar16 = local_40;
      uStack_a0 = local_78;
      lVar18 = local_48;
    }
    sVar3 = *(ushort *)((long)puVar9 + 10) - (*(ushort *)((long)puVar9 + 10) >> 1);
    *(short *)((long)puVar9 + 10) = sVar3;
    *(enet_uint16 *)((long)puVar9 + 0xc) = eVar4 + sVar3;
    context = local_90;
  }
  puVar13 = (ushort *)((long)puVar10 + 0xe);
  puVar20 = (ushort *)((long)puVar9 + 0xe);
  if ((int)uVar15 != 0) goto LAB_00102b8e;
  goto LAB_00102695;
  while( true ) {
    if (bVar1 <= bVar2) {
      bVar1 = *(byte *)((long)puVar10 + 1);
      uVar6 = *(ushort *)((long)puVar10 + 2);
      uVar14 = bVar1 + 1;
      *(ushort *)((long)puVar10 + 2) = uVar6 + 3;
      *(byte *)((long)puVar10 + 1) = bVar1 + 3;
      context = local_90;
      uVar8 = (uVar8 - bVar1) + (uint)uVar6;
      goto LAB_00102aa5;
    }
    uVar8 = (uint)(ushort)((short)uVar8 + *(short *)((long)puVar10 + 2));
    uVar14 = (uint)*(ushort *)((long)puVar10 + 6);
    if (*(ushort *)((long)puVar10 + 6) == 0) break;
LAB_001029a6:
    puVar10 = (undefined8 *)((long)puVar9 + (ulong)(uVar14 << 4));
    bVar2 = *(byte *)((long)puVar9 + (ulong)(uVar14 << 4));
    puVar9 = puVar10;
    if (bVar1 < bVar2) {
      *(short *)((long)puVar10 + 2) = *(short *)((long)puVar10 + 2) + 3;
      uVar14 = (uint)*(ushort *)((long)puVar10 + 4);
      if (*(ushort *)((long)puVar10 + 4) == 0) {
        lVar17 = uStack_a0 * 0x10;
        *(byte *)((long)context + uStack_a0 * 2 * 8) = bVar1;
        *(undefined1 *)((long)context + lVar17 + 1) = 3;
        *(undefined2 *)((long)context + lVar17 + 2) = 3;
        *(undefined8 *)((long)local_90 + lVar17 + 4) = 0;
        *(undefined4 *)((long)local_90 + lVar17 + 0xc) = 0;
        *(short *)((long)puVar10 + 4) =
             (short)((uint)((int)(undefined8 *)((long)context + uStack_a0 * 2 * 8) - (int)puVar10)
                    >> 4);
        puVar10 = (undefined8 *)((long)context + uStack_a0 * 2 * 8);
        goto LAB_00102a61;
      }
      goto LAB_001029a6;
    }
  }
  lVar17 = uStack_a0 * 0x10;
  *(byte *)((long)context + uStack_a0 * 2 * 8) = bVar1;
  *(undefined1 *)((long)context + lVar17 + 1) = 3;
  *(undefined2 *)((long)context + lVar17 + 2) = 3;
  *(undefined8 *)((long)local_90 + lVar17 + 4) = 0;
  *(undefined4 *)((long)local_90 + lVar17 + 0xc) = 0;
  *(short *)((long)puVar10 + 6) =
       (short)((uint)((int)(undefined8 *)((long)context + uStack_a0 * 2 * 8) - (int)puVar10) >> 4);
  puVar10 = (undefined8 *)((long)context + uStack_a0 * 2 * 8);
LAB_00102a61:
  uVar14 = 1;
  context = local_90;
  uStack_a0 = uStack_a0 + 1;
LAB_00102aa5:
  *puVar13 = (ushort)((uint)((int)puVar10 - (int)context) >> 4);
  iVar5 = (int)((uVar22 & 0xffffffff) / (ulong)*(ushort *)((long)context + 0xc));
  uVar8 = ((uVar8 & 0xffff) + (uint)*(ushort *)((long)context + 10)) * iVar5 + (int)uVar19;
  uVar21 = iVar5 * uVar14;
  do {
    uVar22 = (ulong)uVar21;
    uVar19 = (ulong)uVar8;
    if (0xffffff < (uVar21 + uVar8 ^ uVar8)) {
      if (0xffff < uVar21) break;
      uVar21 = -uVar8 & 0xffff;
    }
    if (peVar16 <= outData) {
      return local_88;
    }
    *outData = (enet_uint8)(uVar8 >> 0x18);
    outData = outData + 1;
    uVar21 = uVar21 << 8;
    uVar8 = uVar8 << 8;
  } while( true );
  uVar6 = *(short *)((long)context + 0xc) + 3;
  *(ushort *)((long)context + 0xc) = uVar6;
  if (0xff00 < uVar6 || 0xfa < uVar14) {
    if (*(ushort *)((long)context + 8) == 0) {
      sVar3 = 0x100;
    }
    else {
      local_78 = uStack_a0;
      eVar4 = enet_symbol_rescale((ENetSymbol *)
                                  ((long)context + (ulong)*(ushort *)((long)context + 8) * 2 * 8));
      local_88 = 0;
      sVar3 = eVar4 + 0x100;
      uStack_a0 = local_78;
    }
    sVar7 = *(ushort *)((long)context + 10) - (*(ushort *)((long)context + 10) >> 1);
    *(short *)((long)context + 10) = sVar7;
    *(short *)((long)context + 0xc) = sVar3 + sVar7;
  }
LAB_00102b8e:
  if (local_38 < 2) {
    local_38 = local_38 + 1;
  }
  else {
    predicted = *(enet_uint16 *)((long)context + (ulong)predicted * 0x10 + 0xe);
    local_38 = 2;
  }
  if (0xffd < uStack_a0) {
    *(undefined8 *)context = 0;
    *(undefined8 *)((long)context + 8) = 0;
    *(undefined4 *)((long)context + 10) = 0x1010001;
    predicted = 0;
    local_38 = 0;
    uStack_a0 = 1;
  }
  goto LAB_0010263d;
}

Assistant:

size_t
enet_range_coder_compress (void * context, const ENetBuffer * inBuffers, size_t inBufferCount, size_t inLimit, enet_uint8 * outData, size_t outLimit)
{
    ENetRangeCoder * rangeCoder = (ENetRangeCoder *) context;
    enet_uint8 * outStart = outData, * outEnd = & outData [outLimit];
    const enet_uint8 * inData, * inEnd;
    enet_uint32 encodeLow = 0, encodeRange = ~0;
    ENetSymbol * root;
    enet_uint16 predicted = 0;
    size_t order = 0, nextSymbol = 0;

    if (rangeCoder == NULL || inBufferCount <= 0 || inLimit <= 0)
      return 0;

    inData = (const enet_uint8 *) inBuffers -> data;
    inEnd = & inData [inBuffers -> dataLength];
    inBuffers ++;
    inBufferCount --;

    ENET_CONTEXT_CREATE (root, ENET_CONTEXT_ESCAPE_MINIMUM, ENET_CONTEXT_SYMBOL_MINIMUM);

    for (;;)
    {
        ENetSymbol * subcontext, * symbol;
#ifdef ENET_CONTEXT_EXCLUSION
        const ENetSymbol * childContext = & emptyContext;
#endif
        enet_uint8 value;
        enet_uint16 count, under, * parent = & predicted, total;
        if (inData >= inEnd)
        {
            if (inBufferCount <= 0)
              break;
            inData = (const enet_uint8 *) inBuffers -> data;
            inEnd = & inData [inBuffers -> dataLength];
            inBuffers ++;
            inBufferCount --;
        }
        value = * inData ++;
    
        for (subcontext = & rangeCoder -> symbols [predicted]; 
             subcontext != root; 
#ifdef ENET_CONTEXT_EXCLUSION
             childContext = subcontext, 
#endif
                subcontext = & rangeCoder -> symbols [subcontext -> parent])
        {
            ENET_CONTEXT_ENCODE (subcontext, symbol, value, under, count, ENET_SUBCONTEXT_SYMBOL_DELTA, 0);
            * parent = symbol - rangeCoder -> symbols;
            parent = & symbol -> parent;
            total = subcontext -> total;
#ifdef ENET_CONTEXT_EXCLUSION
            if (childContext -> total > ENET_SUBCONTEXT_SYMBOL_DELTA + ENET_SUBCONTEXT_ESCAPE_DELTA)
              ENET_CONTEXT_ENCODE_EXCLUDE (childContext, value, under, total, 0);
#endif
            if (count > 0)
            {
                ENET_RANGE_CODER_ENCODE (subcontext -> escapes + under, count, total);
            }
            else
            {
                if (subcontext -> escapes > 0 && subcontext -> escapes < total) 
                    ENET_RANGE_CODER_ENCODE (0, subcontext -> escapes, total); 
                subcontext -> escapes += ENET_SUBCONTEXT_ESCAPE_DELTA;
                subcontext -> total += ENET_SUBCONTEXT_ESCAPE_DELTA;
            }
            subcontext -> total += ENET_SUBCONTEXT_SYMBOL_DELTA;
            if (count > 0xFF - 2*ENET_SUBCONTEXT_SYMBOL_DELTA || subcontext -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
              ENET_CONTEXT_RESCALE (subcontext, 0);
            if (count > 0) goto nextInput;
        }

        ENET_CONTEXT_ENCODE (root, symbol, value, under, count, ENET_CONTEXT_SYMBOL_DELTA, ENET_CONTEXT_SYMBOL_MINIMUM);
        * parent = symbol - rangeCoder -> symbols;
        parent = & symbol -> parent;
        total = root -> total;
#ifdef ENET_CONTEXT_EXCLUSION
        if (childContext -> total > ENET_SUBCONTEXT_SYMBOL_DELTA + ENET_SUBCONTEXT_ESCAPE_DELTA)
          ENET_CONTEXT_ENCODE_EXCLUDE (childContext, value, under, total, ENET_CONTEXT_SYMBOL_MINIMUM); 
#endif
        ENET_RANGE_CODER_ENCODE (root -> escapes + under, count, total);
        root -> total += ENET_CONTEXT_SYMBOL_DELTA; 
        if (count > 0xFF - 2*ENET_CONTEXT_SYMBOL_DELTA + ENET_CONTEXT_SYMBOL_MINIMUM || root -> total > ENET_RANGE_CODER_BOTTOM - 0x100)
          ENET_CONTEXT_RESCALE (root, ENET_CONTEXT_SYMBOL_MINIMUM);

    nextInput:
        if (order >= ENET_SUBCONTEXT_ORDER) 
          predicted = rangeCoder -> symbols [predicted].parent;
        else 
          order ++;
        ENET_RANGE_CODER_FREE_SYMBOLS;
    }

    ENET_RANGE_CODER_FLUSH;

    return (size_t) (outData - outStart);
}